

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeUtilities.cpp
# Opt level: O0

CodeLocation __thiscall
soul::SimpleTokeniser::findEndOfMatchingDelimiter
          (SimpleTokeniser *this,CodeLocation *start,TokenType openDelim,TokenType closeDelim)

{
  bool bVar1;
  char *extraout_RDX;
  char *extraout_RDX_00;
  UTF8Reader UVar2;
  CodeLocation CVar3;
  AbortCompilationException *anon_var_0;
  undefined1 local_a0 [8];
  SimpleTokeniser tokeniser;
  CodeLocation *start_local;
  TokenType closeDelim_local;
  TokenType openDelim_local;
  
  tokeniser.super_SOULTokeniser.literalType.text = (char *)start;
  SimpleTokeniser((SimpleTokeniser *)local_a0,start,true);
  bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matches((Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                     *)local_a0,openDelim);
  checkAssertion(bVar1,"tokeniser.matches (openDelim)","findEndOfMatchingDelimiter",0x54);
  bVar1 = skipPastMatchingCloseDelimiter((SimpleTokeniser *)local_a0,openDelim,closeDelim);
  if (bVar1) {
    CodeLocation::CodeLocation
              ((CodeLocation *)this,
               (CodeLocation *)&tokeniser.super_SOULTokeniser.startLocation.location);
  }
  ~SimpleTokeniser((SimpleTokeniser *)local_a0);
  UVar2.data = extraout_RDX_00;
  if (!bVar1) {
    memset(this,0,0x10);
    CodeLocation::CodeLocation((CodeLocation *)this);
    UVar2.data = extraout_RDX;
  }
  CVar3.location.data = UVar2.data;
  CVar3.sourceCode.object = (SourceCodeText *)this;
  return CVar3;
}

Assistant:

static CodeLocation findEndOfMatchingDelimiter (const CodeLocation& start, TokenType openDelim, TokenType closeDelim)
    {
        try
        {
            SimpleTokeniser tokeniser (start, true);
            SOUL_ASSERT (tokeniser.matches (openDelim));

            if (tokeniser.skipPastMatchingCloseDelimiter (openDelim, closeDelim))
                return tokeniser.location;
        }
        catch (const AbortCompilationException&) {}

        return {};
    }